

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDecomposes::~IfcRelDecomposes(IfcRelDecomposes *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x846170;
  *(undefined8 *)&this->field_0x30 = 0x8461e8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x846198;
  *(undefined8 *)this = 0x8461c0;
  pvVar2 = *(void **)&this->field_0x18;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this->field_0x28 - (long)pvVar2);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x846300;
  *(undefined8 *)&this->field_0x30 = 0x846328;
  puVar3 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x10;
  puVar1 = &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x20;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x80 != &this[-1].field_0x90) {
    operator_delete(*(undefined1 **)&this[-1].field_0x80,*(long *)&this[-1].field_0x90 + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x58 != &this[-1].field_0x68) {
    operator_delete(*(undefined1 **)&this[-1].field_0x58,*(long *)&this[-1].field_0x68 + 1);
  }
  operator_delete(&this[-1].field_0x48,0xe0);
  return;
}

Assistant:

IfcRelDecomposes() : Object("IfcRelDecomposes") {}